

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O1

void Message::putMessage(Result code,size_t value)

{
  mapped_type *s1;
  QString local_48;
  Result local_2c;
  QString local_28;
  
  local_2c = code;
  s1 = std::
       map<Result,_QString,_std::less<Result>,_std::allocator<std::pair<const_Result,_QString>_>_>::
       at(&message,&local_2c);
  operator+(&local_28,s1,"%1 \t\n\n");
  QString::arg((ulonglong)&local_48,(int)&local_28,(int)value,(QChar)0x0);
  std::deque<QString,_std::allocator<QString>_>::emplace_back<QString>(&messageQueue.c,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,8);
    }
  }
  if (&(local_28.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_28.d.d)->super_QArrayData,2,8);
    }
  }
  return;
}

Assistant:

void Message::putMessage( Result code, size_t value )
{
    messageQueue.push( QString( message.at( code ) + "%1 \t\n\n" ).arg( value ));
}